

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_unlink.c
# Opt level: O0

mpt_node * mpt_node_unlink(mpt_node *curr)

{
  int *piVar1;
  mpt_node *next;
  mpt_node *curr_local;
  
  if (curr == (mpt_node *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    curr_local = (mpt_node *)0x0;
  }
  else {
    curr_local = curr->next;
    if (curr_local != (mpt_node *)0x0) {
      curr_local->prev = curr->prev;
    }
    if (curr->prev == (mpt_node *)0x0) {
      if (curr->parent != (mpt_node *)0x0) {
        curr->parent->children = curr_local;
      }
    }
    else {
      curr->prev->next = curr_local;
    }
    curr->prev = (mpt_node *)0x0;
    curr->next = (mpt_node *)0x0;
    curr->parent = (mpt_node *)0x0;
  }
  return curr_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_unlink(MPT_STRUCT(node) *curr)
{
	MPT_STRUCT(node)  *next;
	
	if (!curr) {
		errno = EINVAL;
		return 0;
	}
	/* change predecessor of successor */
	if ((next = curr->next)) {
		next->prev = curr->prev;
	}
	/* change successor of predecessor */
	if (curr->prev) {
		curr->prev->next = next;
	}
	/* if no predecessor change child link of parent (if exists) */
	else if (curr->parent) {
		curr->parent->children = next;
	}
	curr->parent = curr->next = curr->prev = 0;
	
	return next;
}